

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O1

void Am_Initialize_Aux(void)

{
  unsigned_short uVar1;
  Am_Constraint *pAVar2;
  Am_Object *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Object_Advanced temp;
  Am_Demon_Set demons;
  Am_Object AStack_38;
  Am_Value_List local_30;
  Am_Demon_Set local_20;
  Am_Value local_18;
  
  Am_Object_Advanced::Am_Object_Advanced((Am_Object_Advanced *)&AStack_38);
  Am_Demon_Set::Am_Demon_Set(&local_20);
  init_screen();
  Am_Object::Create((Am_Object *)&local_18,(char *)&Am_Root_Object);
  pAVar2 = Am_Formula::operator_cast_to_Am_Constraint_(&return_self);
  pAVar3 = Am_Object::Add((Am_Object *)&local_18,0x68,pAVar2,0);
  pAVar3 = Am_Object::Add(pAVar3,100,0,0);
  pAVar3 = Am_Object::Add(pAVar3,0x65,0,0);
  pAVar3 = Am_Object::Add(pAVar3,0x66,100,0);
  pAVar3 = Am_Object::Add(pAVar3,0x67,100,0);
  Am_Value_List::Am_Value_List(&local_30);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_30);
  pAVar3 = Am_Object::Add(pAVar3,0x82,pAVar4,0);
  pAVar3 = Am_Object::Add(pAVar3,0x6e,0,0);
  pAVar3 = Am_Object::Add(pAVar3,0x6f,0,0);
  pAVar3 = Am_Object::Add(pAVar3,0x70,1,0);
  pAVar3 = Am_Object::Add(pAVar3,0x71,1,0);
  pAVar3 = Am_Object::Add(pAVar3,0x6c,"Amulet",0);
  pAVar3 = Am_Object::Add(pAVar3,0x6d,&Am_No_Value,0);
  pAVar3 = Am_Object::Add(pAVar3,0x76,false,0);
  pAVar3 = Am_Object::Add(pAVar3,0x69,true,0);
  pAVar3 = Am_Object::Add(pAVar3,0x74,false,0);
  pAVar3 = Am_Object::Add(pAVar3,0x75,false,0);
  pAVar3 = Am_Object::Add(pAVar3,0x72,false,0);
  pAVar3 = Am_Object::Add(pAVar3,0x73,false,0);
  Am_Object::operator=(&Am_Window,pAVar3);
  Am_Value_List::~Am_Value_List(&local_30);
  Am_Object::~Am_Object((Am_Object *)&local_18);
  pAVar3 = Am_Object::Add(&Am_Window,0x7d2,(Am_Ptr)0x0,0);
  pAVar2 = Am_Formula::operator_cast_to_Am_Constraint_(&window_is_color);
  pAVar3 = Am_Object::Add(pAVar3,0x87,pAVar2,0);
  pAVar3 = Am_Object::Add(pAVar3,0x85,0,0);
  pAVar3 = Am_Object::Add(pAVar3,0x77,false,0);
  pAVar3 = Am_Object::Add(pAVar3,0x78,false,0);
  pAVar3 = Am_Object::Add(pAVar3,0x7a,0,0);
  pAVar3 = Am_Object::Add(pAVar3,0x7b,0,0);
  pAVar3 = Am_Object::Add(pAVar3,0x7c,0,0);
  pAVar3 = Am_Object::Add(pAVar3,0x7d,0,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_White);
  pAVar3 = Am_Object::Add(pAVar3,0x6a,pAVar4,0);
  pAVar4 = Am_Cursor::operator_cast_to_Am_Wrapper_(&Am_Default_Cursor);
  pAVar3 = Am_Object::Add(pAVar3,0x7e,pAVar4,0);
  pAVar3 = Am_Object::Add(pAVar3,0x79,false,0);
  pAVar3 = Am_Object::Add(pAVar3,0x80,false,0);
  pAVar3 = Am_Object::Add(pAVar3,0x7f,false,0);
  pAVar2 = Am_Formula::operator_cast_to_Am_Constraint_(&compute_depth);
  pAVar3 = Am_Object::Add(pAVar3,0x86,pAVar2,0);
  pAVar3 = Am_Object::Add(pAVar3,2000,am_window_draw.from_wrapper,0);
  pAVar3 = Am_Object::Add(pAVar3,0x7d7,window_invalid.from_wrapper,0);
  pAVar3 = Am_Object::Add(pAVar3,0x7d9,generic_point_in_obj.from_wrapper,0);
  pAVar3 = Am_Object::Add(pAVar3,0x7da,am_group_point_in_part.from_wrapper,0);
  pAVar3 = Am_Object::Add(pAVar3,0x7db,am_group_point_in_leaf.from_wrapper,0);
  pAVar3 = Am_Object::Add(pAVar3,0x7dc,window_translate_coordinates.from_wrapper,0);
  pAVar3 = Am_Object::Add(pAVar3,0x124,(Am_Ptr)0x0,0);
  pAVar3 = Am_Object::Add(pAVar3,299,0,0);
  pAVar3 = Am_Object::Add(pAVar3,0x8a,true,0);
  pAVar3 = Am_Object::Add(pAVar3,0x89,Am_Default_Window_Destroy_Method.from_wrapper,0);
  pAVar3 = Am_Object::Add(pAVar3,0x7e1,0,0);
  pAVar3 = Am_Object::Add(pAVar3,0x7e2,0,0);
  pAVar3 = Am_Object::Add(pAVar3,0xdb,false,0);
  pAVar3 = Am_Object::Add(pAVar3,0x9e,0,0);
  pAVar3 = Am_Object::Add(pAVar3,0x9f,0,0);
  pAVar3 = Am_Object::Add(pAVar3,0x95,0,0);
  pAVar3 = Am_Object::Add(pAVar3,0x96,0,0);
  pAVar3 = Am_Object::Add(pAVar3,0xa0,0,0);
  pAVar3 = Am_Object::Add(pAVar3,0xa1,0,0);
  local_30.item = (Am_List_Item *)(ulong)Am_CENTER_ALIGN.value;
  local_30.data = (Am_Value_List_Data *)CONCAT62(local_30.data._2_6_,Am_Alignment::Am_Alignment_ID);
  pAVar3 = Am_Object::Add(pAVar3,0x97,(Am_Value *)&local_30,0);
  local_18.value.long_value._4_4_ = 0;
  local_18.value.float_value = (float)Am_CENTER_ALIGN.value;
  local_18.type = Am_Alignment::Am_Alignment_ID;
  pAVar3 = Am_Object::Add(pAVar3,0x98,&local_18,0);
  pAVar3 = Am_Object::Add(pAVar3,0x99,0,0);
  pAVar3 = Am_Object::Add(pAVar3,0x9a,0,0);
  pAVar3 = Am_Object::Add(pAVar3,0x9b,0,0);
  pAVar3 = Am_Object::Add(pAVar3,0x9c,false,0);
  pAVar3 = Am_Object::Add(pAVar3,0x9d,false,0);
  Am_Object::Add(pAVar3,0x174,0,0);
  Am_Value::~Am_Value(&local_18);
  Am_Value::~Am_Value((Am_Value *)&local_30);
  Am_Object::operator=(&AStack_38,&Am_Window);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x124);
  Am_Slot::Set_Inherit_Rule((Am_Slot *)&local_30,Am_LOCAL);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,299);
  Am_Slot::Set_Inherit_Rule((Am_Slot *)&local_30,Am_LOCAL);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x7e1);
  Am_Slot::Set_Inherit_Rule((Am_Slot *)&local_30,Am_LOCAL);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x7e2);
  Am_Slot::Set_Inherit_Rule((Am_Slot *)&local_30,Am_LOCAL);
  Am_Object_Advanced::Get_Demons((Am_Object_Advanced *)&local_18);
  Am_Demon_Set::Copy((Am_Demon_Set *)&local_30);
  Am_Demon_Set::operator=(&local_20,(Am_Demon_Set *)&local_30);
  Am_Demon_Set::~Am_Demon_Set((Am_Demon_Set *)&local_30);
  Am_Demon_Set::~Am_Demon_Set((Am_Demon_Set *)&local_18);
  Am_Demon_Set::Set_Object_Demon(&local_20,Am_CREATE_OBJ,window_create);
  Am_Demon_Set::Set_Object_Demon(&local_20,Am_COPY_OBJ,window_copy);
  Am_Demon_Set::Set_Object_Demon(&local_20,Am_DESTROY_OBJ,window_destroy_demon);
  Am_Demon_Set::Set_Part_Demon(&local_20,Am_ADD_PART,am_generic_add_part);
  Am_Demon_Set::Set_Part_Demon(&local_20,Am_CHANGE_OWNER,window_change_owner);
  Am_Demon_Set::Set_Slot_Demon(&local_20,4,window_common_slot,5);
  Am_Demon_Set::Set_Slot_Demon(&local_20,8,window_uncommon_slot,5);
  uVar1 = Am_Object_Advanced::Get_Demon_Mask((Am_Object_Advanced *)&AStack_38);
  Am_Object_Advanced::Set_Demon_Mask((Am_Object_Advanced *)&AStack_38,uVar1 | 0xc);
  Am_Object_Advanced::Set_Demons((Am_Object_Advanced *)&AStack_38,&local_20);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,100);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_30,5);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x65);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_30,5);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x66);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_30,5);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x67);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_30,5);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x6e);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_30,9);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x6f);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_30,9);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x70);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_30,9);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x71);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_30,9);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x6c);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_30,9);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x6d);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_30,9);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x76);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_30,9);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x69);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_30,9);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x74);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_30,9);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x75);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_30,9);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x72);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_30,9);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x73);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_30,9);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x6a);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_30,9);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x7e);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_30,9);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x79);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_30,9);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x80);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_30,9);
  local_30.data =
       (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&AStack_38,0x7f);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_30,9);
  init_graphical_object();
  Am_Demon_Set::~Am_Demon_Set(&local_20);
  Am_Object::~Am_Object(&AStack_38);
  return;
}

Assistant:

void
Am_Initialize_Aux()
{
  Am_Object_Advanced temp;
  Am_Demon_Set demons;
  unsigned short demon_mask;

  init_screen();

  Am_Window = Am_Root_Object.Create(DSTR("Am_Window"))
                  .Add(Am_WINDOW, return_self)
#ifndef _MACINTOSH
                  .Add(Am_LEFT, 0)
                  .Add(Am_TOP, 0)
#else
                  .Add(Am_LEFT, 20)
                  .Add(Am_TOP, 50)
#endif
                  .Add(Am_WIDTH, 100)
                  .Add(Am_HEIGHT, 100)
                  .Add(Am_GRAPHICAL_PARTS, Am_Value_List())
                  .Add(Am_MAX_WIDTH, 0)
                  .Add(Am_MAX_HEIGHT, 0)
                  .Add(Am_MIN_WIDTH, 1)
                  .Add(Am_MIN_HEIGHT, 1)
                  .Add(Am_TITLE, "Amulet")
                  .Add(Am_ICON_TITLE, Am_No_Value) //use title if no icon title
                  .Add(Am_ICONIFIED, false)
                  .Add(Am_VISIBLE, true)
                  .Add(Am_USE_MIN_WIDTH, false)
                  .Add(Am_USE_MIN_HEIGHT, false)
                  .Add(Am_USE_MAX_WIDTH, false)
                  .Add(Am_USE_MAX_HEIGHT, false);

  Am_Window //need to split because of MSC compiler limit
      .Add(Am_DRAWONABLE, (Am_Ptr)nullptr) //##
      .Add(Am_IS_COLOR, window_is_color)
      .Add(Am_RANK, 0)
      .Add(Am_QUERY_POSITION, false)
      .Add(Am_QUERY_SIZE, false)
      .Add(Am_LEFT_BORDER_WIDTH, 0)
      .Add(Am_TOP_BORDER_WIDTH, 0)
      .Add(Am_RIGHT_BORDER_WIDTH, 0)
      .Add(Am_BOTTOM_BORDER_WIDTH, 0)
      .Add(Am_FILL_STYLE, Am_White)
      .Add(Am_CURSOR, Am_Default_Cursor) // use arrow
      .Add(Am_OMIT_TITLE_BAR, false)
      .Add(Am_CLIP_CHILDREN, false)
      .Add(Am_SAVE_UNDER, false)
      .Add(Am_OWNER_DEPTH, compute_depth)
      .Add(Am_DRAW_METHOD, am_window_draw)
      .Add(Am_INVALID_METHOD, window_invalid)
      .Add(Am_POINT_IN_OBJ_METHOD, generic_point_in_obj)
      .Add(Am_POINT_IN_PART_METHOD, am_group_point_in_part)
      .Add(Am_POINT_IN_LEAF_METHOD, am_group_point_in_leaf)
      .Add(Am_TRANSLATE_COORDINATES_METHOD, window_translate_coordinates)
      .Add(Am_INTER_LIST, (Am_Ptr)nullptr)
      .Add(Am_WINDOW_WANT_MOVE_CNT, 0)
      .Add(Am_DOUBLE_BUFFER, true)
      //.Set (Am_DOUBLE_BUFFER, false)
      .Add(Am_DESTROY_WINDOW_METHOD, Am_Default_Window_Destroy_Method)
      .Add(Am_WAITING_FOR_COMPLETION, (int)Am_INTER_NOT_WAITING)
      .Add(Am_COMPLETION_VALUE, (0L))
      .Add(Am_AS_LINE, false) //windows are not like lines
      // These are for grouping and alignment methods
      .Add(Am_LEFT_OFFSET, 0)
      .Add(Am_TOP_OFFSET, 0)
      .Add(Am_H_SPACING, 0)
      .Add(Am_V_SPACING, 0)
      .Add(Am_RIGHT_OFFSET, 0)
      .Add(Am_BOTTOM_OFFSET, 0)
      .Add(Am_H_ALIGN, Am_CENTER_ALIGN)
      .Add(Am_V_ALIGN, Am_CENTER_ALIGN)
      .Add(Am_FIXED_WIDTH, Am_NOT_FIXED_SIZE)
      .Add(Am_FIXED_HEIGHT, Am_NOT_FIXED_SIZE)
      .Add(Am_INDENT, 0)
      .Add(Am_MAX_RANK, false)
      .Add(Am_MAX_SIZE, false)
      .Add(Am_UNDO_HANDLER, (0L));
  temp = (Am_Object_Advanced &)Am_Window;
  // slots of all Windows that must be local only
  temp.Get_Slot(Am_INTER_LIST).Set_Inherit_Rule(Am_LOCAL);
  temp.Get_Slot(Am_WINDOW_WANT_MOVE_CNT).Set_Inherit_Rule(Am_LOCAL);
  //next two are for windows used as pop-ups
  temp.Get_Slot(Am_WAITING_FOR_COMPLETION).Set_Inherit_Rule(Am_LOCAL);
  temp.Get_Slot(Am_COMPLETION_VALUE).Set_Inherit_Rule(Am_LOCAL);

#ifdef DEBUG
  Am_Window.Add(Am_OBJECT_IN_PROGRESS, 0)
      .Set_Inherit_Rule(Am_OBJECT_IN_PROGRESS, Am_LOCAL);
#endif

  demons = temp.Get_Demons().Copy();
  demons.Set_Object_Demon(Am_CREATE_OBJ, window_create);
  demons.Set_Object_Demon(Am_COPY_OBJ, window_copy);
  demons.Set_Object_Demon(Am_DESTROY_OBJ, window_destroy_demon);
  demons.Set_Part_Demon(Am_ADD_PART, am_generic_add_part);
  demons.Set_Part_Demon(Am_CHANGE_OWNER, window_change_owner);
  demons.Set_Slot_Demon(Am_COMMON_SLOT, window_common_slot,
                        Am_DEMON_PER_OBJECT | Am_DEMON_ON_CHANGE);
  demons.Set_Slot_Demon(Am_UNCOMMON_SLOT, window_uncommon_slot,
                        Am_DEMON_PER_OBJECT | Am_DEMON_ON_CHANGE);
  demon_mask = temp.Get_Demon_Mask();
  demon_mask |= 0x0004 | 0x0008;
  temp.Set_Demon_Mask(demon_mask);
  temp.Set_Demons(demons);

  temp.Get_Slot(Am_LEFT).Set_Demon_Bits(Am_COMMON_SLOT | Am_EAGER_DEMON);
  temp.Get_Slot(Am_TOP).Set_Demon_Bits(Am_COMMON_SLOT | Am_EAGER_DEMON);
  temp.Get_Slot(Am_WIDTH).Set_Demon_Bits(Am_COMMON_SLOT | Am_EAGER_DEMON);
  temp.Get_Slot(Am_HEIGHT).Set_Demon_Bits(Am_COMMON_SLOT | Am_EAGER_DEMON);

  temp.Get_Slot(Am_MAX_WIDTH).Set_Demon_Bits(Am_UNCOMMON_SLOT | Am_EAGER_DEMON);
  temp.Get_Slot(Am_MAX_HEIGHT)
      .Set_Demon_Bits(Am_UNCOMMON_SLOT | Am_EAGER_DEMON);
  temp.Get_Slot(Am_MIN_WIDTH).Set_Demon_Bits(Am_UNCOMMON_SLOT | Am_EAGER_DEMON);
  temp.Get_Slot(Am_MIN_HEIGHT)
      .Set_Demon_Bits(Am_UNCOMMON_SLOT | Am_EAGER_DEMON);
  temp.Get_Slot(Am_TITLE).Set_Demon_Bits(Am_UNCOMMON_SLOT | Am_EAGER_DEMON);
  temp.Get_Slot(Am_ICON_TITLE)
      .Set_Demon_Bits(Am_UNCOMMON_SLOT | Am_EAGER_DEMON);
  temp.Get_Slot(Am_ICONIFIED).Set_Demon_Bits(Am_UNCOMMON_SLOT | Am_EAGER_DEMON);
  temp.Get_Slot(Am_VISIBLE).Set_Demon_Bits(Am_UNCOMMON_SLOT | Am_EAGER_DEMON);
  temp.Get_Slot(Am_USE_MIN_WIDTH)
      .Set_Demon_Bits(Am_UNCOMMON_SLOT | Am_EAGER_DEMON);
  temp.Get_Slot(Am_USE_MIN_HEIGHT)
      .Set_Demon_Bits(Am_UNCOMMON_SLOT | Am_EAGER_DEMON);
  temp.Get_Slot(Am_USE_MAX_WIDTH)
      .Set_Demon_Bits(Am_UNCOMMON_SLOT | Am_EAGER_DEMON);
  temp.Get_Slot(Am_USE_MAX_HEIGHT)
      .Set_Demon_Bits(Am_UNCOMMON_SLOT | Am_EAGER_DEMON);
  /* temporary since need new form of Set to override the read-only
  temp.Get_Slot (Am_LEFT_BORDER_WIDTH).Set_Read_Only (true);
  temp.Get_Slot (Am_TOP_BORDER_WIDTH).Set_Read_Only (true);
  temp.Get_Slot (Am_RIGHT_BORDER_WIDTH).Set_Read_Only (true);
  temp.Get_Slot (Am_BOTTOM_BORDER_WIDTH).Set_Read_Only (true);
*/
  temp.Get_Slot(Am_FILL_STYLE)
      .Set_Demon_Bits(Am_UNCOMMON_SLOT | Am_EAGER_DEMON);
  temp.Get_Slot(Am_CURSOR).Set_Demon_Bits(Am_UNCOMMON_SLOT | Am_EAGER_DEMON);
  temp.Get_Slot(Am_OMIT_TITLE_BAR)
      .Set_Demon_Bits(Am_UNCOMMON_SLOT | Am_EAGER_DEMON);
  temp.Get_Slot(Am_CLIP_CHILDREN)
      .Set_Demon_Bits(Am_UNCOMMON_SLOT | Am_EAGER_DEMON);
  temp.Get_Slot(Am_SAVE_UNDER)
      .Set_Demon_Bits(Am_UNCOMMON_SLOT | Am_EAGER_DEMON);

  init_graphical_object();
}